

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
::
nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,std::tuple<slang::syntax::PropertyExprSyntax_const*,slang::ast::ASTContext>>>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,try_emplace_args_t *args,
          Symbol **args_1,
          tuple<const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *args_2)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  bitmask<slang::ast::ASTFlags> *pbVar3;
  TempVarSymbol **ppTVar4;
  ulong uVar5;
  group_type_pointer pgVar6;
  value_type_pointer ppVar7;
  uint uVar8;
  ushort uVar9;
  byte bVar10;
  underlying_type uVar11;
  Symbol *pSVar12;
  TempVarSymbol *pTVar13;
  RandomizeDetails *pRVar14;
  _Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext> *p_Var15;
  SymbolIndex SVar16;
  undefined4 uVar17;
  long lVar18;
  undefined1 auVar19 [16];
  
  uVar5 = arrays_->groups_size_mask;
  pgVar6 = arrays_->groups_;
  lVar18 = 1;
  while( true ) {
    pgVar1 = pgVar6 + pos0;
    pgVar2 = pgVar6 + pos0;
    bVar10 = pgVar2->m[0xf].n;
    auVar19[0] = -(pgVar2->m[0].n == '\0');
    auVar19[1] = -(pgVar2->m[1].n == '\0');
    auVar19[2] = -(pgVar2->m[2].n == '\0');
    auVar19[3] = -(pgVar2->m[3].n == '\0');
    auVar19[4] = -(pgVar2->m[4].n == '\0');
    auVar19[5] = -(pgVar2->m[5].n == '\0');
    auVar19[6] = -(pgVar2->m[6].n == '\0');
    auVar19[7] = -(pgVar2->m[7].n == '\0');
    auVar19[8] = -(pgVar2->m[8].n == '\0');
    auVar19[9] = -(pgVar2->m[9].n == '\0');
    auVar19[10] = -(pgVar2->m[10].n == '\0');
    auVar19[0xb] = -(pgVar2->m[0xb].n == '\0');
    auVar19[0xc] = -(pgVar2->m[0xc].n == '\0');
    auVar19[0xd] = -(pgVar2->m[0xd].n == '\0');
    auVar19[0xe] = -(pgVar2->m[0xe].n == '\0');
    auVar19[0xf] = -(bVar10 == 0);
    uVar9 = (ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe;
    if (uVar9 != 0) break;
    pgVar1->m[0xf].n = bVar10 | '\x01' << ((byte)hash & 7);
    pos0 = pos0 + lVar18 & uVar5;
    lVar18 = lVar18 + 1;
  }
  uVar8 = 0;
  if (uVar9 != 0) {
    for (; (uVar9 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
    }
  }
  ppVar7 = arrays_->elements_;
  ppVar7[pos0 * 0xf + (ulong)uVar8].first = *args_1;
  SVar16 = (args_2->
           super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
           ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
           super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.lookupIndex;
  uVar17 = *(undefined4 *)
            &(args_2->
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
             ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.field_0xc;
  uVar11 = (args_2->
           super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
           ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
           super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags.m_bits;
  pSVar12 = (args_2->
            super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
            ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
            super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.instanceOrProc;
  pTVar13 = (args_2->
            super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
            ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
            super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar;
  pRVar14 = (args_2->
            super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
            ).super__Tuple_impl<1UL,_slang::ast::ASTContext>.
            super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.randomizeDetails;
  ppVar7[pos0 * 0xf + (ulong)uVar8].second.
  super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
  super__Tuple_impl<1UL,_slang::ast::ASTContext>.
  super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr =
       (args_2->
       super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>).
       super__Tuple_impl<1UL,_slang::ast::ASTContext>.
       super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.scope.ptr;
  p_Var15 = &ppVar7[pos0 * 0xf + (ulong)uVar8].second.
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
  ;
  (p_Var15->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
  super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.lookupIndex = SVar16;
  *(undefined4 *)
   &(p_Var15->super__Tuple_impl<1UL,_slang::ast::ASTContext>).
    super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.field_0xc = uVar17;
  pbVar3 = &ppVar7[pos0 * 0xf + (ulong)uVar8].second.
            super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
            .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
            super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.flags;
  pbVar3->m_bits = uVar11;
  pbVar3[1] = (bitmask<slang::ast::ASTFlags>)pSVar12;
  ppTVar4 = &ppVar7[pos0 * 0xf + (ulong)uVar8].second.
             super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>
             .super__Tuple_impl<1UL,_slang::ast::ASTContext>.
             super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.firstTempVar;
  *ppTVar4 = pTVar13;
  ppTVar4[1] = (TempVarSymbol *)pRVar14;
  ppVar7[pos0 * 0xf + (ulong)uVar8].second.
  super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
  super__Tuple_impl<1UL,_slang::ast::ASTContext>.
  super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.assertionInstance =
       (args_2->
       super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>).
       super__Tuple_impl<1UL,_slang::ast::ASTContext>.
       super__Head_base<1UL,_slang::ast::ASTContext,_false>._M_head_impl.assertionInstance;
  ppVar7[pos0 * 0xf + (ulong)uVar8].second.
  super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>.
  super__Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false>._M_head_impl =
       (args_2->
       super__Tuple_impl<0UL,_const_slang::syntax::PropertyExprSyntax_*,_slang::ast::ASTContext>).
       super__Head_base<0UL,_const_slang::syntax::PropertyExprSyntax_*,_false>._M_head_impl;
  pgVar1->m[uVar8].n =
       *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                   ::word + ((uint)hash & 0xff));
  __return_storage_ptr__->pg = pgVar1;
  __return_storage_ptr__->n = uVar8;
  __return_storage_ptr__->p = ppVar7 + pos0 * 0xf + (ulong)uVar8;
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }